

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# importer.cpp
# Opt level: O0

void __thiscall
Importer_isResolvedUnitsWithModel_Test::TestBody(Importer_isResolvedUnitsWithModel_Test *this)

{
  byte bVar1;
  bool bVar2;
  element_type *peVar3;
  char *pcVar4;
  AssertionResult local_d8 [2];
  AssertHelper local_b8 [8];
  Message local_b0 [15];
  bool local_a1;
  undefined1 local_a0 [8];
  AssertionResult gtest_ar_;
  string local_88 [32];
  undefined1 local_68 [8];
  UnitsPtr units;
  allocator<char> local_41;
  string local_40 [32];
  undefined1 local_20 [8];
  ModelPtr model;
  Importer_isResolvedUnitsWithModel_Test *this_local;
  
  model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_40,"model",&local_41);
  libcellml::Model::create((string *)local_20);
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator(&local_41);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_88,"units",(allocator<char> *)((long)&gtest_ar_.message_.ptr_ + 7));
  libcellml::Units::create((string *)local_68);
  std::__cxx11::string::~string(local_88);
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_ar_.message_.ptr_ + 7));
  peVar3 = std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_20);
  libcellml::Model::addUnits((shared_ptr *)peVar3);
  std::__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             local_68);
  bVar1 = libcellml::Units::requiresImports();
  local_a1 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_a0,&local_a1,(type *)0x0)
  ;
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a0);
  if (!bVar2) {
    testing::Message::Message(local_b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (local_d8,local_a0,"units->requiresImports()","true");
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (local_b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/importer/importer.cpp"
               ,0x380,pcVar4);
    testing::internal::AssertHelper::operator=(local_b8,local_b0);
    testing::internal::AssertHelper::~AssertHelper(local_b8);
    std::__cxx11::string::~string((string *)local_d8);
    testing::Message::~Message(local_b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a0);
  std::shared_ptr<libcellml::Units>::~shared_ptr((shared_ptr<libcellml::Units> *)local_68);
  std::shared_ptr<libcellml::Model>::~shared_ptr((shared_ptr<libcellml::Model> *)local_20);
  return;
}

Assistant:

TEST(Importer, isResolvedUnitsWithModel)
{
    auto model = libcellml::Model::create("model");
    auto units = libcellml::Units::create("units");

    model->addUnits(units);

    EXPECT_FALSE(units->requiresImports());
}